

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_object_values(parser *p)

{
  errr eVar1;
  errr eVar2;
  char *pcVar3;
  parser_error pVar4;
  random_value *value_00;
  wchar_t index;
  wchar_t value;
  int local_48;
  int local_44;
  void *local_40;
  char *local_38;
  
  local_40 = parser_priv(p);
  if (local_40 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"values");
    local_38 = string_make(pcVar3);
    pcVar3 = strtok(local_38," |");
    if (pcVar3 == (char *)0x0) {
      pVar4 = PARSE_ERROR_NONE;
    }
    else {
      value_00 = (random_value *)((long)local_40 + 0x88);
      do {
        local_44 = 0;
        local_48 = 0;
        eVar1 = grab_rand_value(value_00,obj_mods,pcVar3);
        eVar2 = grab_index_and_int(&local_44,&local_48,element_names,"RES_",pcVar3);
        if (eVar2 == 0) {
          *(undefined2 *)((long)local_40 + (long)local_48 * 4 + 0x188) = (undefined2)local_44;
        }
        else if (eVar1 != 0) {
          pVar4 = PARSE_ERROR_INVALID_VALUE;
          break;
        }
        pVar4 = PARSE_ERROR_NONE;
        pcVar3 = strtok((char *)0x0," |");
      } while (pcVar3 != (char *)0x0);
    }
    string_free(local_38);
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_object_values(struct parser *p) {
	struct object_kind *k = parser_priv(p);
	char *s, *t;

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		int value = 0;
		int index = 0;
		bool found = false;
		if (!grab_rand_value(k->modifiers, obj_mods, t)) {
			found = true;
		}
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			k->el_info[index].res_level = value;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}